

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedersen_impl.h
# Opt level: O0

void secp256k1_pedersen_ecmult
               (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_gej *rj,secp256k1_scalar *sec
               ,uint64_t value,secp256k1_ge *genp)

{
  undefined1 local_b0 [8];
  secp256k1_gej vj;
  secp256k1_ge *genp_local;
  uint64_t value_local;
  secp256k1_scalar *sec_local;
  secp256k1_gej *rj_local;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx_local;
  
  vj._120_8_ = genp;
  secp256k1_ecmult_gen(ecmult_gen_ctx,rj,sec);
  secp256k1_pedersen_ecmult_small((secp256k1_gej *)local_b0,value,(secp256k1_ge *)vj._120_8_);
  secp256k1_gej_add_var(rj,rj,(secp256k1_gej *)local_b0,(secp256k1_fe *)0x0);
  secp256k1_gej_clear((secp256k1_gej *)local_b0);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_pedersen_ecmult(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_gej *rj, const secp256k1_scalar *sec, uint64_t value, const secp256k1_ge* genp) {
    secp256k1_gej vj;
    secp256k1_ecmult_gen(ecmult_gen_ctx, rj, sec);
    secp256k1_pedersen_ecmult_small(&vj, value, genp);
    /* FIXME: constant time. */
    secp256k1_gej_add_var(rj, rj, &vj, NULL);
    secp256k1_gej_clear(&vj);
}